

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

string * __thiscall
duckdb::Date::ToString_abi_cxx11_(string *__return_storage_ptr__,Date *this,date_t date)

{
  bool bVar1;
  int iVar2;
  int year;
  long lVar3;
  char *pcVar4;
  long lVar5;
  allocator *paVar6;
  date_t d;
  ulong uVar7;
  int32_t date_units [3];
  allocator local_3e;
  allocator local_3d;
  int local_3c;
  int32_t local_38;
  int32_t local_34;
  
  d.days = (int32_t)this;
  if (d.days == -0x7fffffff) {
    paVar6 = &local_3e;
    pcVar4 = NINF;
  }
  else {
    if (d.days != 0x7fffffff) {
      Convert(d,&local_3c,&local_38,&local_34);
      iVar2 = local_3c;
      lVar3 = 6;
      if (local_3c < 1) {
        local_3c = 1 - local_3c;
        lVar3 = 0xb;
      }
      year = local_3c;
      lVar5 = (ulong)(999999 < local_3c) + (ulong)(99999 < local_3c) + (ulong)(9999 < local_3c);
      bVar1 = 9999999 < local_3c;
      uVar7 = lVar3 + lVar5 + (ulong)bVar1 + 4;
      pcVar4 = (char *)operator_new__(uVar7);
      DateToStringCast::Format(pcVar4,year,local_38,local_34,(ulong)bVar1 + lVar5 + 4,iVar2 < 1);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar4,pcVar4 + uVar7);
      operator_delete__(pcVar4);
      return __return_storage_ptr__;
    }
    paVar6 = &local_3d;
    pcVar4 = PINF;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,paVar6);
  return __return_storage_ptr__;
}

Assistant:

string Date::ToString(date_t date) {
	// PG displays temporal infinities in lowercase,
	// but numerics in Titlecase.
	if (date == date_t::infinity()) {
		return PINF;
	} else if (date == date_t::ninfinity()) {
		return NINF;
	}
	int32_t date_units[3];
	idx_t year_length;
	bool add_bc;
	Date::Convert(date, date_units[0], date_units[1], date_units[2]);

	auto length = DateToStringCast::Length(date_units, year_length, add_bc);
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(length);
	DateToStringCast::Format(buffer.get(), date_units, year_length, add_bc);
	return string(buffer.get(), length);
}